

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileutils.c
# Opt level: O3

void write_crl(scep *s)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  X509_CRL *x;
  FILE *pFVar4;
  X509 *pXVar5;
  X509_NAME *pXVar6;
  char *pcVar7;
  char *pcVar8;
  X509_NAME *b;
  FILE *pFVar9;
  FILE *pFVar10;
  ASN1_INTEGER *x_00;
  FILE *fp;
  BIO *bp;
  PKCS7 *pPVar11;
  X509_EXTENSION *pXVar12;
  ulong uVar13;
  ulong uVar14;
  undefined8 uVar15;
  FILE *unaff_RBX;
  char *unaff_RBP;
  int *piVar16;
  long lVar17;
  X509 *pXVar18;
  char **unaff_R14;
  ulong uVar19;
  char **unaff_R15;
  uint uStack_1d1c;
  PKCS7 *pPStack_1d18;
  BIO *pBStack_1d10;
  long lStack_1d08;
  byte abStack_1d00 [64];
  char acStack_1cc0 [1024];
  char acStack_18c0 [1032];
  FILE *pFStack_14b8;
  int *piStack_14b0;
  X509 *pXStack_14a8;
  FILE *pFStack_14a0;
  char **ppcStack_1498;
  code *pcStack_1490;
  int aiStack_1488 [258];
  FILE *pFStack_1080;
  int *piStack_1078;
  X509 *pXStack_1070;
  X509_CRL *pXStack_1068;
  FILE *pFStack_1060;
  code *pcStack_1058;
  char acStack_1050 [1024];
  char acStack_c50 [1024];
  char acStack_850 [2056];
  FILE *pFStack_48;
  
  pFVar10 = (FILE *)((s->reply_p7->d).sign)->crl;
  x = (X509_CRL *)OPENSSL_sk_value(pFVar10,0);
  if (x == (X509_CRL *)0x0) {
    write_crl_cold_3();
LAB_0010d9ac:
    write_crl_cold_2();
  }
  else {
    unaff_R15 = &w_char;
    pFVar10 = (FILE *)w_char;
    pFVar4 = fopen(w_char,"w");
    unaff_R14 = (char **)x;
    if (pFVar4 == (FILE *)0x0) goto LAB_0010d9ac;
    if (v_flag != 0) {
      printf("%s: writing CRL\n",pname);
    }
    if (d_flag != 0) {
      PEM_write_X509_CRL(_stdout,x);
    }
    pFVar10 = pFVar4;
    iVar2 = PEM_write_X509_CRL(pFVar4,x);
    unaff_RBX = pFVar4;
    if (iVar2 == 1) {
      printf("%s: CRL written as %s\n",pname,w_char);
      fclose(pFVar4);
      return;
    }
  }
  write_crl_cold_1();
  localcert = (X509 *)0x0;
  pFVar10 = *(FILE **)(*(long *)(pFVar10->__pad5 + 0x20) + 0x10);
  pFStack_48 = unaff_RBX;
  if (v_flag != 0) {
    pcStack_1058 = (code *)0x10d9f7;
    uVar3 = OPENSSL_sk_num(pFVar10);
    pcStack_1058 = (code *)0x10da07;
    printf("write_local_cert(): found %d cert(s)\n",(ulong)uVar3);
  }
  pcStack_1058 = (code *)0x10da0f;
  pFVar4 = pFVar10;
  iVar2 = OPENSSL_sk_num();
  pXVar5 = (X509 *)localcert;
  if (0 < iVar2) {
    unaff_R14 = (char **)0x0;
    do {
      pcStack_1058 = (code *)0x10da25;
      pXVar5 = (X509 *)OPENSSL_sk_value(pFVar10,unaff_R14);
      pcVar8 = pname;
      if (v_flag != 0) {
        pcStack_1058 = (code *)0x10da45;
        pXVar6 = X509_get_subject_name(pXVar5);
        pcStack_1058 = (code *)0x10da58;
        pcVar7 = X509_NAME_oneline(pXVar6,acStack_1050,0x400);
        pcStack_1058 = (code *)0x10da6c;
        printf("%s: found certificate with\n  subject: \'%s\'\n",pcVar8,pcVar7);
        pcStack_1058 = (code *)0x10da74;
        pXVar6 = X509_get_issuer_name(pXVar5);
        pcStack_1058 = (code *)0x10da84;
        pcVar8 = X509_NAME_oneline(pXVar6,acStack_1050,0x400);
        pcStack_1058 = (code *)0x10da95;
        printf("  issuer: %s\n",pcVar8);
        pcStack_1058 = (code *)0x10daa1;
        pXVar6 = (X509_NAME *)X509_REQ_get_subject_name(request);
        pcStack_1058 = (code *)0x10dab1;
        pcVar8 = X509_NAME_oneline(pXVar6,acStack_1050,0x400);
        pcStack_1058 = (code *)0x10dac2;
        printf("  request_subject: \'%s\'\n",pcVar8);
        unaff_RBP = acStack_1050;
      }
      pcStack_1058 = (code *)0x10daca;
      pXVar6 = X509_get_subject_name(pXVar5);
      pcStack_1058 = (code *)0x10dad9;
      b = (X509_NAME *)X509_REQ_get_subject_name(request);
      pcStack_1058 = (code *)0x10dae4;
      iVar2 = X509_NAME_cmp(pXVar6,b);
      if (d_flag != 0) {
        pcStack_1058 = (code *)0x10dbc5;
        write_local_cert_cold_1();
      }
      if (iVar2 == 0) {
LAB_0010db6a:
        if (v_flag != 0) {
          pcStack_1058 = (code *)0x10db7d;
          puts("CN\'s of request and certificate matched!");
        }
      }
      else {
        pcStack_1058 = (code *)0x10db04;
        pXVar6 = X509_get_subject_name(pXVar5);
        pcStack_1058 = (code *)0x10db1c;
        X509_NAME_oneline(pXVar6,acStack_850,0x400);
        pcStack_1058 = (code *)0x10db28;
        pXVar6 = (X509_NAME *)X509_REQ_get_subject_name(request);
        unaff_RBP = acStack_c50;
        pcStack_1058 = (code *)0x10db40;
        X509_NAME_oneline(pXVar6,unaff_RBP,0x400);
        if (v_flag != 0) {
          pcStack_1058 = (code *)0x10db5b;
          printf(" X509_NAME_cmp() workaround: strcmp request subject (%s) to cert subject (%s)\n",
                 unaff_RBP,acStack_850);
        }
        pcStack_1058 = (code *)0x10db66;
        iVar2 = strcmp(acStack_850,unaff_RBP);
        if (iVar2 == 0) goto LAB_0010db6a;
        pcStack_1058 = (code *)0x10dbcf;
        write_local_cert_cold_2();
      }
      pcStack_1058 = (code *)0x10db85;
      unaff_R15 = (char **)X509_get_subject_name(pXVar5);
      pcStack_1058 = (code *)0x10db90;
      pXVar6 = X509_get_issuer_name(pXVar5);
      pcStack_1058 = (code *)0x10db9b;
      pFVar4 = (FILE *)unaff_R15;
      iVar2 = X509_NAME_cmp((X509_NAME *)unaff_R15,pXVar6);
      if (iVar2 != 0) break;
      uVar3 = (int)unaff_R14 + 1;
      unaff_R14 = (char **)(ulong)uVar3;
      pcStack_1058 = (code *)0x10dbaa;
      pFVar4 = pFVar10;
      iVar2 = OPENSSL_sk_num();
      pXVar5 = (X509 *)localcert;
    } while ((int)uVar3 < iVar2);
  }
  localcert = (X509 *)pXVar5;
  pXVar18 = localcert;
  if (localcert == (X509 *)0x0) {
    pcStack_1058 = (code *)0x10dc7f;
    write_local_cert_cold_5();
  }
  else {
    unaff_R14 = &l_char;
    pcStack_1058 = (code *)0x10dc00;
    pFVar4 = (FILE *)l_char;
    pFVar9 = fopen(l_char,"w");
    if (pFVar9 != (FILE *)0x0) {
      if (v_flag != 0) {
        pcStack_1058 = (code *)0x10dc2a;
        printf("%s: certificate written as %s\n",pname,l_char);
      }
      if (d_flag != 0) {
        pcStack_1058 = (code *)0x10dc4c;
        PEM_write_X509(_stdout,(X509 *)localcert);
      }
      pcStack_1058 = (code *)0x10dc5b;
      pFVar4 = pFVar9;
      iVar2 = PEM_write_X509(pFVar9,(X509 *)localcert);
      pFVar10 = pFVar9;
      if (iVar2 == 1) {
        pcStack_1058 = (code *)0x10dc68;
        fclose(pFVar9);
        return;
      }
      goto LAB_0010dc84;
    }
  }
  pcStack_1058 = (code *)0x10dc84;
  write_local_cert_cold_4();
LAB_0010dc84:
  pcStack_1058 = write_other_cert;
  write_local_cert_cold_3();
  piStack_1078 = &v_flag;
  uVar15 = *(undefined8 *)(*(long *)(pFVar4->__pad5 + 0x20) + 0x10);
  pcStack_1490 = (code *)0x10dcb4;
  pFStack_1080 = pFVar10;
  pXStack_1070 = pXVar18;
  pXStack_1068 = (X509_CRL *)unaff_R14;
  pFStack_1060 = (FILE *)unaff_R15;
  pcStack_1058 = (code *)unaff_RBP;
  iVar2 = OPENSSL_sk_num(uVar15);
  piVar16 = &v_flag;
  if (0 < iVar2) {
    pXVar18 = (X509 *)0x0;
    do {
      pcStack_1490 = (code *)0x10dccd;
      pFVar10 = (FILE *)OPENSSL_sk_value(uVar15,pXVar18);
      pcVar8 = pname;
      if (v_flag != 0) {
        pcStack_1490 = (code *)0x10dcee;
        pXVar6 = X509_get_subject_name((X509 *)pFVar10);
        pcStack_1490 = (code *)0x10dcfe;
        pcVar7 = X509_NAME_oneline(pXVar6,(char *)aiStack_1488,0x400);
        pcStack_1490 = (code *)0x10dd12;
        printf("%s: found certificate with\n  subject: %s\n",pcVar8,pcVar7);
        pcStack_1490 = (code *)0x10dd1a;
        pXVar6 = X509_get_issuer_name((X509 *)pFVar10);
        pcStack_1490 = (code *)0x10dd2a;
        pcVar7 = X509_NAME_oneline(pXVar6,(char *)aiStack_1488,0x400);
        pcStack_1490 = (code *)0x10dd3b;
        printf("  issuer: %s\n",pcVar7);
        unaff_RBP = pcVar8;
      }
      pcStack_1490 = (code *)0x10dd43;
      x_00 = X509_get_serialNumber((X509 *)pFVar10);
      pcStack_1490 = (code *)0x10dd56;
      iVar2 = ASN1_INTEGER_cmp(x_00,*(ASN1_INTEGER **)((long)pFVar4->__pad3 + 8));
      piVar16 = aiStack_1488;
      if (iVar2 == 0) goto LAB_0010dd73;
      uVar3 = (int)pXVar18 + 1;
      pXVar18 = (X509 *)(ulong)uVar3;
      pcStack_1490 = (code *)0x10dd65;
      iVar2 = OPENSSL_sk_num(uVar15);
      piVar16 = aiStack_1488;
    } while ((int)uVar3 < iVar2);
  }
  do {
    pcStack_1490 = (code *)0x10dd73;
    write_other_cert_cold_3();
LAB_0010dd73:
  } while (pFVar10 == (FILE *)0x0);
  pcStack_1490 = (code *)0x10dd8e;
  pFVar9 = (FILE *)w_char;
  fp = fopen(w_char,"w");
  if (fp == (FILE *)0x0) {
    pcStack_1490 = (code *)0x10de0a;
    write_other_cert_cold_2();
  }
  else {
    if (v_flag != 0) {
      pcStack_1490 = (code *)0x10ddbd;
      printf("%s: certificate written as %s\n",pname,w_char);
    }
    if (d_flag != 0) {
      pcStack_1490 = (code *)0x10dddb;
      PEM_write_X509(_stdout,(X509 *)pFVar10);
    }
    pcStack_1490 = (code *)0x10dde6;
    pFVar9 = fp;
    iVar2 = PEM_write_X509(fp,(X509 *)pFVar10);
    pFVar4 = fp;
    if (iVar2 == 1) {
      pcStack_1490 = (code *)0x10ddf3;
      fclose(fp);
      return;
    }
  }
  pcStack_1490 = write_ca_ra;
  write_other_cert_cold_1();
  ppcStack_1498 = &w_char;
  pFStack_14b8 = pFVar10;
  piStack_14b0 = piVar16;
  pXStack_14a8 = pXVar18;
  pFStack_14a0 = pFVar4;
  pcStack_1490 = (code *)unaff_RBP;
  bp = BIO_new_mem_buf(pFVar9->_IO_read_end,*(int *)&pFVar9->_IO_read_base);
  pPVar11 = d2i_PKCS7_bio(bp,(PKCS7 **)0x0);
  if (pPVar11 == (PKCS7 *)0x0) {
    pcVar8 = "%s: error reading PKCS#7 data\n";
LAB_0010de5c:
    fprintf(_stderr,pcVar8,pname);
LAB_0010de66:
    ERR_print_errors_fp(_stderr);
  }
  else {
    iVar2 = OBJ_obj2nid(pPVar11->type);
    if (iVar2 == 0x16) {
      lVar17 = ((pPVar11->d).data)->flags;
      if (lVar17 != 0) {
        pPStack_1d18 = pPVar11;
        pBStack_1d10 = bp;
        iVar2 = OPENSSL_sk_num(lVar17);
        if (0 < iVar2) {
          uVar19 = 0;
          lStack_1d08 = lVar17;
          do {
            memset(acStack_18c0,0,0x400);
            memset(acStack_1cc0,0,0x400);
            pXVar5 = (X509 *)OPENSSL_sk_value(lVar17,uVar19);
            snprintf(acStack_1cc0,0x400,"%s-%d",c_char,uVar19);
            pcVar8 = pname;
            if (v_flag != 0) {
              pXVar6 = X509_get_subject_name(pXVar5);
              pcVar7 = X509_NAME_oneline(pXVar6,acStack_18c0,0x400);
              printf("\n%s: found certificate with\n  subject: %s\n",pcVar8,pcVar7);
              if (v_flag != 0) {
                pXVar6 = X509_get_issuer_name(pXVar5);
                pcVar8 = X509_NAME_oneline(pXVar6,acStack_18c0,0x400);
                printf("  issuer: %s\n",pcVar8);
              }
            }
            iVar2 = X509_digest(pXVar5,(EVP_MD *)fp_alg,abStack_1d00,&uStack_1d1c);
            if (iVar2 == 0) goto LAB_0010de66;
            iVar2 = X509_get_ext_by_NID(pXVar5,0x57,-1);
            if (iVar2 < 0) {
              if (v_flag != 0) {
                puts("  basic constraints: (not included)");
              }
            }
            else {
              pXVar12 = X509_get_ext(pXVar5,iVar2);
              if (v_flag != 0) {
                printf("  basic constraints: ");
                X509V3_EXT_print_fp(_stdout,pXVar12,0,0);
                putchar(10);
              }
            }
            iVar2 = X509_get_ext_by_NID(pXVar5,0x53,-1);
            if (iVar2 < 0) {
              if (v_flag != 0) {
                puts("  usage: (not included)");
                goto LAB_0010e0d7;
              }
            }
            else {
              pXVar12 = X509_get_ext(pXVar5,iVar2);
              if (v_flag != 0) {
                printf("  usage: ");
                X509V3_EXT_print_fp(_stdout,pXVar12,0,0);
                putchar(10);
LAB_0010e0d7:
                if (v_flag != 0) {
                  iVar2 = EVP_MD_get_type(fp_alg);
                  pcVar8 = OBJ_nid2sn(iVar2);
                  printf("  %s fingerprint: ",pcVar8);
                  uVar14 = (ulong)uStack_1d1c;
                  if (0 < (int)uStack_1d1c) {
                    uVar13 = 0;
                    do {
                      uVar1 = uVar13 + 1;
                      uVar15 = 10;
                      if (uVar1 != (uVar14 & 0xffffffff)) {
                        uVar15 = 0x3a;
                      }
                      printf("%02X%c",(ulong)abStack_1d00[uVar13],uVar15);
                      uVar14 = (ulong)(int)uStack_1d1c;
                      uVar13 = uVar1;
                    } while ((long)uVar1 < (long)uVar14);
                  }
                }
              }
            }
            pFVar10 = fopen(acStack_1cc0,"w");
            if (pFVar10 == (FILE *)0x0) {
              pcVar8 = "%s: cannot open cert file for writing\n";
              goto LAB_0010dea6;
            }
            if (v_flag != 0) {
              printf("%s: certificate written as %s\n",pname,acStack_1cc0);
            }
            if (d_flag != 0) {
              PEM_write_X509(_stdout,pXVar5);
            }
            iVar2 = PEM_write_X509(pFVar10,pXVar5);
            if (iVar2 != 1) {
              pcVar8 = "%s: error while writing certificate file\n";
              goto LAB_0010de5c;
            }
            fclose(pFVar10);
            lVar17 = lStack_1d08;
            uVar3 = (int)uVar19 + 1;
            uVar19 = (ulong)uVar3;
            iVar2 = OPENSSL_sk_num(lStack_1d08);
          } while ((int)uVar3 < iVar2);
        }
        PKCS7_free(pPStack_1d18);
        BIO_free(pBStack_1d10);
        exit(0);
      }
      pcVar8 = "%s: cannot find certificates\n";
LAB_0010dea6:
      fprintf(_stderr,pcVar8,pname);
    }
    else {
      printf("%s: wrong PKCS#7 type\n",pname);
    }
  }
  exit(0x5d);
}

Assistant:

void
write_crl(struct scep *s) {
	PKCS7			*p7;
	STACK_OF(X509_CRL)	*crls;
	X509_CRL		*crl;	
	FILE			*fp;

	/* Get CRL */
	p7 = s->reply_p7;
	crls = p7->d.sign->crl;
	
	/* We expect only one CRL: */
	crl = sk_X509_CRL_value(crls, 0);
	if (crl == NULL) {
		fprintf(stderr, "%s: cannot find CRL in reply\n", pname);
		exit (SCEP_PKISTATUS_FILE);
	}

	/* Write PEM-formatted file: */
#ifdef WIN32
	if ((fopen_s(&fp, w_char, "w")))
#else
	if (!(fp = fopen(w_char, "w")))
#endif
	{
		fprintf(stderr, "%s: cannot open CRL file for writing\n",
				pname);
		exit (SCEP_PKISTATUS_FILE);
	}
	if (v_flag)
		printf("%s: writing CRL\n", pname);
	if (d_flag)
		PEM_write_X509_CRL(stdout, crl);
	if (PEM_write_X509_CRL(fp, crl) != 1) {
		fprintf(stderr, "%s: error while writing CRL "
			"file\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_FILE);
	}
	printf("%s: CRL written as %s\n", pname, w_char);
	(void)fclose(fp);
}